

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost89.c
# Opt level: O3

void mac_block(gost_ctx *c,byte *buffer,byte *block)

{
  int i;
  long lVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  
  lVar1 = 0;
  do {
    buffer[lVar1] = buffer[lVar1] ^ block[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 8);
  iVar5 = c->mask[0] + c->key[0];
  uVar8 = iVar5 + *(uint *)buffer;
  uVar8 = *(uint *)((long)c->k65 + (ulong)(uVar8 >> 0xe & 0x3fc)) | c->k87[uVar8 >> 0x18] |
          c->k43[uVar8 >> 8 & 0xff] | c->k21[uVar8 & 0xff];
  uVar9 = (uVar8 << 0xb | uVar8 >> 0x15) ^ *(uint *)(buffer + 4);
  iVar2 = c->mask[1] + c->key[1];
  uVar8 = iVar2 + uVar9;
  uVar8 = *(uint *)((long)c->k65 + (ulong)(uVar8 >> 0xe & 0x3fc)) | c->k87[uVar8 >> 0x18] |
          c->k43[uVar8 >> 8 & 0xff] | c->k21[uVar8 & 0xff];
  iVar6 = c->mask[2] + c->key[2];
  uVar3 = (uVar8 << 0xb | uVar8 >> 0x15) ^ *(uint *)buffer;
  uVar8 = iVar6 + uVar3;
  uVar8 = *(uint *)((long)c->k65 + (ulong)(uVar8 >> 0xe & 0x3fc)) | c->k87[uVar8 >> 0x18] |
          c->k43[uVar8 >> 8 & 0xff] | c->k21[uVar8 & 0xff];
  iVar7 = c->mask[3] + c->key[3];
  uVar9 = (uVar8 << 0xb | uVar8 >> 0x15) ^ uVar9;
  uVar8 = iVar7 + uVar9;
  uVar8 = *(uint *)((long)c->k65 + (ulong)(uVar8 >> 0xe & 0x3fc)) | c->k87[uVar8 >> 0x18] |
          c->k43[uVar8 >> 8 & 0xff] | c->k21[uVar8 & 0xff];
  iVar10 = c->mask[4] + c->key[4];
  uVar3 = (uVar8 << 0xb | uVar8 >> 0x15) ^ uVar3;
  uVar8 = iVar10 + uVar3;
  uVar8 = *(uint *)((long)c->k65 + (ulong)(uVar8 >> 0xe & 0x3fc)) | c->k87[uVar8 >> 0x18] |
          c->k43[uVar8 >> 8 & 0xff] | c->k21[uVar8 & 0xff];
  iVar4 = c->mask[5] + c->key[5];
  uVar9 = (uVar8 << 0xb | uVar8 >> 0x15) ^ uVar9;
  uVar8 = iVar4 + uVar9;
  uVar8 = *(uint *)((long)c->k65 + (ulong)(uVar8 >> 0xe & 0x3fc)) | c->k87[uVar8 >> 0x18] |
          c->k43[uVar8 >> 8 & 0xff] | c->k21[uVar8 & 0xff];
  iVar11 = c->mask[6] + c->key[6];
  uVar3 = (uVar8 << 0xb | uVar8 >> 0x15) ^ uVar3;
  uVar8 = iVar11 + uVar3;
  uVar8 = *(uint *)((long)c->k65 + (ulong)(uVar8 >> 0xe & 0x3fc)) | c->k87[uVar8 >> 0x18] |
          c->k43[uVar8 >> 8 & 0xff] | c->k21[uVar8 & 0xff];
  iVar12 = c->mask[7] + c->key[7];
  uVar9 = (uVar8 << 0xb | uVar8 >> 0x15) ^ uVar9;
  uVar8 = iVar12 + uVar9;
  uVar8 = *(uint *)((long)c->k65 + (ulong)(uVar8 >> 0xe & 0x3fc)) | c->k87[uVar8 >> 0x18] |
          c->k43[uVar8 >> 8 & 0xff] | c->k21[uVar8 & 0xff];
  uVar3 = (uVar8 << 0xb | uVar8 >> 0x15) ^ uVar3;
  uVar8 = iVar5 + uVar3;
  uVar8 = *(uint *)((long)c->k65 + (ulong)(uVar8 >> 0xe & 0x3fc)) | c->k87[uVar8 >> 0x18] |
          c->k43[uVar8 >> 8 & 0xff] | c->k21[uVar8 & 0xff];
  uVar9 = (uVar8 << 0xb | uVar8 >> 0x15) ^ uVar9;
  uVar8 = iVar2 + uVar9;
  uVar8 = *(uint *)((long)c->k65 + (ulong)(uVar8 >> 0xe & 0x3fc)) | c->k87[uVar8 >> 0x18] |
          c->k43[uVar8 >> 8 & 0xff] | c->k21[uVar8 & 0xff];
  uVar3 = (uVar8 << 0xb | uVar8 >> 0x15) ^ uVar3;
  uVar8 = iVar6 + uVar3;
  uVar8 = *(uint *)((long)c->k65 + (ulong)(uVar8 >> 0xe & 0x3fc)) | c->k87[uVar8 >> 0x18] |
          c->k43[uVar8 >> 8 & 0xff] | c->k21[uVar8 & 0xff];
  uVar9 = (uVar8 << 0xb | uVar8 >> 0x15) ^ uVar9;
  uVar8 = iVar7 + uVar9;
  uVar8 = *(uint *)((long)c->k65 + (ulong)(uVar8 >> 0xe & 0x3fc)) | c->k87[uVar8 >> 0x18] |
          c->k43[uVar8 >> 8 & 0xff] | c->k21[uVar8 & 0xff];
  uVar3 = (uVar8 << 0xb | uVar8 >> 0x15) ^ uVar3;
  uVar8 = iVar10 + uVar3;
  uVar8 = *(uint *)((long)c->k65 + (ulong)(uVar8 >> 0xe & 0x3fc)) | c->k87[uVar8 >> 0x18] |
          c->k43[uVar8 >> 8 & 0xff] | c->k21[uVar8 & 0xff];
  uVar9 = (uVar8 << 0xb | uVar8 >> 0x15) ^ uVar9;
  uVar8 = iVar4 + uVar9;
  uVar8 = *(uint *)((long)c->k65 + (ulong)(uVar8 >> 0xe & 0x3fc)) | c->k87[uVar8 >> 0x18] |
          c->k43[uVar8 >> 8 & 0xff] | c->k21[uVar8 & 0xff];
  uVar3 = (uVar8 << 0xb | uVar8 >> 0x15) ^ uVar3;
  uVar8 = iVar11 + uVar3;
  uVar8 = *(uint *)((long)c->k65 + (ulong)(uVar8 >> 0xe & 0x3fc)) | c->k87[uVar8 >> 0x18] |
          c->k43[uVar8 >> 8 & 0xff] | c->k21[uVar8 & 0xff];
  uVar9 = (uVar8 << 0xb | uVar8 >> 0x15) ^ uVar9;
  uVar8 = iVar12 + uVar9;
  uVar8 = *(uint *)((long)c->k65 + (ulong)(uVar8 >> 0xe & 0x3fc)) | c->k87[uVar8 >> 0x18] |
          c->k43[uVar8 >> 8 & 0xff] | c->k21[uVar8 & 0xff];
  uVar3 = (uVar8 << 0xb | uVar8 >> 0x15) ^ uVar3;
  *buffer = (byte)uVar3;
  buffer[1] = (byte)(uVar3 >> 8);
  buffer[2] = (byte)(uVar3 >> 0x10);
  buffer[3] = (byte)(uVar3 >> 0x18);
  buffer[4] = (byte)uVar9;
  buffer[5] = (byte)(uVar9 >> 8);
  buffer[6] = (byte)(uVar9 >> 0x10);
  buffer[7] = (byte)(uVar9 >> 0x18);
  return;
}

Assistant:

void mac_block(gost_ctx * c, byte * buffer, const byte * block)
{
    register word32 n1, n2;     /* As named in the GOST */
    int i;
    for (i = 0; i < 8; i++) {
        buffer[i] ^= block[i];
    }
    n1 = buffer[0] | (buffer[1] << 8) | (buffer[2] << 16) | ((word32)
                                                             buffer[3] << 24);
    n2 = buffer[4] | (buffer[5] << 8) | (buffer[6] << 16) | ((word32)
                                                             buffer[7] << 24);
    /* Instead of swapping halves, swap names each round */

    n2 ^= f(c, n1 + c->key[0] + c->mask[0]);
    n1 ^= f(c, n2 + c->key[1] + c->mask[1]);
    n2 ^= f(c, n1 + c->key[2] + c->mask[2]);
    n1 ^= f(c, n2 + c->key[3] + c->mask[3]);
    n2 ^= f(c, n1 + c->key[4] + c->mask[4]);
    n1 ^= f(c, n2 + c->key[5] + c->mask[5]);
    n2 ^= f(c, n1 + c->key[6] + c->mask[6]);
    n1 ^= f(c, n2 + c->key[7] + c->mask[7]);

    n2 ^= f(c, n1 + c->key[0] + c->mask[0]);
    n1 ^= f(c, n2 + c->key[1] + c->mask[1]);
    n2 ^= f(c, n1 + c->key[2] + c->mask[2]);
    n1 ^= f(c, n2 + c->key[3] + c->mask[3]);
    n2 ^= f(c, n1 + c->key[4] + c->mask[4]);
    n1 ^= f(c, n2 + c->key[5] + c->mask[5]);
    n2 ^= f(c, n1 + c->key[6] + c->mask[6]);
    n1 ^= f(c, n2 + c->key[7] + c->mask[7]);

    buffer[0] = (byte) (n1 & 0xff);
    buffer[1] = (byte) ((n1 >> 8) & 0xff);
    buffer[2] = (byte) ((n1 >> 16) & 0xff);
    buffer[3] = (byte) (n1 >> 24);
    buffer[4] = (byte) (n2 & 0xff);
    buffer[5] = (byte) ((n2 >> 8) & 0xff);
    buffer[6] = (byte) ((n2 >> 16) & 0xff);
    buffer[7] = (byte) (n2 >> 24);
}